

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O2

Capture * findopen(Capture *cap)

{
  Capture *pCVar1;
  int n;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
LAB_001240d1:
  pCVar1 = cap;
  if (pCVar1[-1].kind != '\0') goto code_r0x001240da;
  iVar2 = iVar2 + 1;
  goto LAB_001240ed;
code_r0x001240da:
  cap = pCVar1 + -1;
  if (pCVar1[-1].siz == '\0') {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      return pCVar1 + -1;
    }
LAB_001240ed:
    cap = pCVar1 + -1;
  }
  goto LAB_001240d1;
}

Assistant:

static Capture *findopen (Capture *cap) {
  int n = 0;  /* number of closes waiting an open */
  for (;;) {
    cap--;
    if (isclosecap(cap)) n++;  /* one more open to skip */
    else if (!isfullcap(cap))
      if (n-- == 0) return cap;
  }
}